

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

Plausibility __thiscall
capnp::compiler::CompilerMain::isPlausiblyPackedFlat
          (CompilerMain *this,ArrayPtr<const_unsigned_char> prefix)

{
  ArrayPtr<const_unsigned_char> prefix_00;
  Plausibility PVar1;
  Type local_50;
  Function<capnp::compiler::CompilerMain::Plausibility_(kj::ArrayPtr<const_unsigned_char>)> local_48
  ;
  CompilerMain *local_38;
  uchar *puStack_30;
  CompilerMain *local_20;
  CompilerMain *this_local;
  ArrayPtr<const_unsigned_char> prefix_local;
  
  puStack_30 = (uchar *)prefix.size_;
  local_38 = (CompilerMain *)prefix.ptr;
  local_50.this = this;
  local_20 = this;
  this_local = local_38;
  prefix_local.ptr = puStack_30;
  kj::Function<capnp::compiler::CompilerMain::Plausibility(kj::ArrayPtr<unsigned_char_const>)>::
  Function<capnp::compiler::CompilerMain::isPlausiblyPackedFlat(kj::ArrayPtr<unsigned_char_const>)::_lambda(kj::ArrayPtr<unsigned_char_const>)_1_>
            ((Function<capnp::compiler::CompilerMain::Plausibility(kj::ArrayPtr<unsigned_char_const>)>
              *)&local_48,&local_50);
  prefix_00.size_ = (size_t)puStack_30;
  prefix_00.ptr = (uchar *)local_38;
  PVar1 = isPlausiblyPacked(this,prefix_00,&local_48);
  kj::Function<capnp::compiler::CompilerMain::Plausibility_(kj::ArrayPtr<const_unsigned_char>)>::
  ~Function(&local_48);
  return PVar1;
}

Assistant:

Plausibility isPlausiblyPackedFlat(kj::ArrayPtr<const byte> prefix) {
    return isPlausiblyPacked(prefix, [this](kj::ArrayPtr<const byte> prefix) {
      return isPlausiblyFlat(prefix);
    });
  }